

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedQueue.h
# Opt level: O3

GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
* __thiscall
ThreadedQueue<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>
::dequeue(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *__return_storage_ptr__,
         ThreadedQueue<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>
         *this)

{
  _Elt_pointer rhs;
  deque<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
  *this_00;
  unique_lock<std::mutex> lock;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  elem;
  unique_lock<std::mutex> local_90;
  Data local_80;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_70;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMStack_68;
  CrtAllocator *local_60;
  CrtAllocator *pCStack_58;
  char *local_50;
  char *pcStack_48;
  char *local_40;
  size_t sStack_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  size_t sStack_28;
  
  local_90._M_owns = false;
  local_90._M_device = &this->mutex;
  std::unique_lock<std::mutex>::lock(&local_90);
  local_90._M_owns = true;
  if (this->size == 0) {
    do {
      std::condition_variable::wait((unique_lock *)&this->c);
    } while (this->size == 0);
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)&local_80.s,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  rhs = (this->priority_queue).
        super__Deque_base<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->priority_queue).
      super__Deque_base<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == rhs) {
    this_00 = &this->queue;
    rhs = (this->queue).
          super__Deque_base<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur;
  }
  else {
    this_00 = &this->priority_queue;
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::operator=((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               *)&local_80.s,rhs);
  std::
  deque<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>,_std::allocator<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>_>
  ::pop_front(this_00);
  this->size = this->size - 1;
  (__return_storage_ptr__->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.n = local_80.n;
  (__return_storage_ptr__->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.s.str = (Ch *)CONCAT26(local_80.f.flags,local_80._8_6_);
  local_80.f.flags = 0;
  __return_storage_ptr__->allocator_ = local_70;
  __return_storage_ptr__->ownAllocator_ = pMStack_68;
  (__return_storage_ptr__->stack_).allocator_ = local_60;
  (__return_storage_ptr__->stack_).ownAllocator_ = pCStack_58;
  (__return_storage_ptr__->stack_).stack_ = local_50;
  (__return_storage_ptr__->stack_).stackTop_ = pcStack_48;
  (__return_storage_ptr__->stack_).stackEnd_ = local_40;
  (__return_storage_ptr__->stack_).initialCapacity_ = sStack_38;
  local_40 = (char *)0x0;
  sStack_38 = 0;
  local_50 = (char *)0x0;
  pcStack_48 = (char *)0x0;
  local_60 = (CrtAllocator *)0x0;
  pCStack_58 = (CrtAllocator *)0x0;
  *(ulong *)&__return_storage_ptr__->parseResult_ = CONCAT44(uStack_2c,local_30);
  (__return_storage_ptr__->parseResult_).offset_ = sStack_28;
  local_30 = 0;
  sStack_28 = 0;
  local_70 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  pMStack_68 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)&local_80.s);
  std::unique_lock<std::mutex>::~unique_lock(&local_90);
  return __return_storage_ptr__;
}

Assistant:

T dequeue () {
        std::unique_lock<std::mutex> lock(mutex);
        c.wait(lock, [this]{ return size; });

        T elem;

        if (priority_queue.empty()) {
            elem = std::move(queue.front());
            queue.pop_front();
        } else {
            elem = std::move(priority_queue.front());
            priority_queue.pop_front();
        }
        size--;

        return std::move(elem);
    }